

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O1

void __thiscall
CommandLineArguments::addNameFilter(CommandLineArguments *this,int ac,char **av,int *i)

{
  TestFilter *pTVar1;
  int ac_00;
  SimpleString SStack_48;
  
  pTVar1 = (TestFilter *)
           operator_new(0x20,
                        "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O1/CMake/cpputest/cpputest-src/src/CppUTest/CommandLineArguments.cpp"
                        ,300);
  ac_00 = 0x14c8b7;
  SimpleString::SimpleString(&SStack_48,"-n");
  getParameterField((CommandLineArguments *)&stack0xffffffffffffffc8,ac_00,(char **)(ulong)(uint)ac,
                    (int *)av,(SimpleString *)i);
  TestFilter::TestFilter(pTVar1,(SimpleString *)&stack0xffffffffffffffc8);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffc8);
  SimpleString::~SimpleString(&SStack_48);
  pTVar1 = TestFilter::add(pTVar1,this->nameFilters_);
  this->nameFilters_ = pTVar1;
  return;
}

Assistant:

void CommandLineArguments::addNameFilter(int ac, const char *const *av, int& i)
{
    TestFilter* nameFilter = new TestFilter(getParameterField(ac, av, i, "-n"));
    nameFilters_ = nameFilter->add(nameFilters_);
}